

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::cmInstallTargetGenerator
          (cmInstallTargetGenerator *this,string *targetName,char *dest,bool implib,
          char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool optional)

{
  pointer pcVar1;
  allocator local_31;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallTargetGenerator_00612118;
  (this->TargetName)._M_dataplus._M_p = (pointer)&(this->TargetName).field_2;
  pcVar1 = (targetName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->TargetName,pcVar1,pcVar1 + targetName->_M_string_length);
  this->Target = (cmGeneratorTarget *)0x0;
  std::__cxx11::string::string((string *)&this->FilePermissions,file_permissions,&local_31);
  this->ImportLibrary = implib;
  this->Optional = optional;
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
  return;
}

Assistant:

cmInstallTargetGenerator
::cmInstallTargetGenerator(const std::string& targetName,
                           const char* dest, bool implib,
                           const char* file_permissions,
                           std::vector<std::string> const& configurations,
                           const char* component,
                           MessageLevel message,
                           bool optional):
  cmInstallGenerator(dest, configurations, component, message),
  TargetName(targetName),
  Target(0),
  FilePermissions(file_permissions),
  ImportLibrary(implib),
  Optional(optional)
{
  this->ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
}